

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

void __thiscall VFS::CVFS::CVFSFile::Clear(CVFSFile *this)

{
  mutex *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::
    vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
    ::clear(&this->m_Data);
    ReserveChunks(this,4);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void Clear()
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        m_Data.clear();
                        ReserveChunks(4);
                    }